

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O0

vm_lookup_val * __thiscall
CVmObjLookupTable::find_entry
          (CVmObjLookupTable *this,vm_val_t *key,uint *hashval_p,vm_lookup_val **prv_entry_p)

{
  uint uVar1;
  int iVar2;
  vm_lookup_ext *this_00;
  undefined8 *in_RCX;
  uint *in_RDX;
  CVmObjLookupTable *in_RDI;
  vm_lookup_val *prv_entry;
  vm_lookup_val *entry;
  uint hashval;
  vm_lookup_ext *ext;
  vm_lookup_val *local_40;
  vm_val_t *in_stack_ffffffffffffffc8;
  vm_lookup_val *pvVar3;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  this_00 = get_ext(in_RDI);
  uVar1 = calc_key_hash((CVmObjLookupTable *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
  if (in_RDX != (uint *)0x0) {
    *in_RDX = uVar1;
  }
  local_40 = (vm_lookup_val *)0x0;
  pvVar3 = this_00->buckets[uVar1];
  while ((pvVar3 != (vm_lookup_val *)0x0 &&
         (iVar2 = vm_val_t::equals((vm_val_t *)this_00,
                                   (vm_val_t *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                                   (int)((ulong)pvVar3 >> 0x20)), iVar2 == 0))) {
    local_40 = pvVar3;
    pvVar3 = pvVar3->nxt;
  }
  if (in_RCX != (undefined8 *)0x0) {
    *in_RCX = local_40;
  }
  return pvVar3;
}

Assistant:

vm_lookup_val *CVmObjLookupTable::find_entry(VMG_ const vm_val_t *key,
                                             uint *hashval_p,
                                             vm_lookup_val **prv_entry_p)
{
    vm_lookup_ext *ext = get_ext();
    uint hashval;
    vm_lookup_val *entry;
    vm_lookup_val *prv_entry;

    /* compute the hash value (and return it to the caller if desired) */
    hashval = calc_key_hash(vmg_ key);
    if (hashval_p != 0)
        *hashval_p = hashval;

    /* scan the hash chain for this entry */
    for (prv_entry = 0, entry = ext->buckets[hashval] ; entry != 0 ;
         prv_entry = entry, entry = entry->nxt)
    {
        /* if it matches the key we're looking for, this is the one */
        if (entry->key.equals(vmg_ key))
            break;
    }

    /* if the caller wanted to know the previous entry, tell them */
    if (prv_entry_p != 0)
        *prv_entry_p = prv_entry;

    /* return the entry where we found the key, if indeed we found it */
    return entry;
}